

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O0

PatternGeneration * __thiscall
PatternGeneration::getChessTexture
          (PatternGeneration *this,Scalar *color1,Scalar *color2,int blockSize,int squares)

{
  int iVar1;
  undefined4 in_register_0000000c;
  int iVar2;
  Scalar_ *__return_storage_ptr__;
  int in_R9D;
  _InputArray local_148;
  _InputArray local_130;
  _InputArray local_118;
  Rect_<int> local_100;
  undefined1 local_f0 [8];
  Mat ROI;
  int local_8c;
  int local_88;
  int j;
  int i;
  undefined1 local_78 [8];
  Scalar color_;
  int imageSize;
  int squares_local;
  int blockSize_local;
  Scalar *color2_local;
  Scalar *color1_local;
  PatternGeneration *this_local;
  Mat *chessBoard;
  
  iVar1 = squares * in_R9D;
  __return_storage_ptr__ = (Scalar_ *)(color_.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 3)
  ;
  cv::Scalar_<double>::all((Scalar_<double> *)__return_storage_ptr__,0.0);
  cv::Mat::Mat((Mat *)this,iVar1,iVar1,0x10,__return_storage_ptr__);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_78);
  for (local_88 = 0; iVar2 = (int)__return_storage_ptr__, local_88 < iVar1;
      local_88 = local_88 + squares) {
    for (local_8c = 0; local_8c < iVar1; local_8c = local_8c + squares) {
      __return_storage_ptr__ = (Scalar_ *)(ulong)(uint)squares;
      cv::Rect_<int>::Rect_(&local_100,local_88,local_8c,squares,squares);
      cv::Mat::operator()((Mat *)local_f0,(Rect *)this);
      if ((local_88 + local_8c) % 2 == 0) {
        cv::Scalar_<double>::operator=((Scalar_<double> *)local_78,color2);
      }
      else {
        cv::Scalar_<double>::operator=
                  ((Scalar_<double> *)local_78,
                   (Scalar_<double> *)CONCAT44(in_register_0000000c,blockSize));
      }
      cv::_InputArray::_InputArray<double,4,1>(&local_118,(Matx<double,_4,_1> *)local_78);
      cv::noArray();
      cv::Mat::setTo((_InputArray *)local_f0,&local_118);
      cv::_InputArray::~_InputArray(&local_118);
      cv::Mat::~Mat((Mat *)local_f0);
    }
  }
  cv::_InputArray::_InputArray(&local_130,(Mat *)this);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_148,(Mat *)this);
  cv::cvtColor((cv *)&local_130,&local_148,(_OutputArray *)0x39,0,iVar2);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_148);
  cv::_InputArray::~_InputArray(&local_130);
  return this;
}

Assistant:

cv::Mat PatternGeneration::getChessTexture(
    const cv::Scalar & color1,
    const cv::Scalar & color2,
    int blockSize,
    int squares)
{
    int imageSize=blockSize*squares;
    cv::Mat chessBoard(imageSize,imageSize,CV_8UC3,cv::Scalar::all(0));

    cv::Scalar color_;
    

    for (int i=0;i<imageSize;i=i+blockSize){
        for (int j=0;j<imageSize;j=j+blockSize){
            cv::Mat ROI=chessBoard(cv::Rect(i,j,blockSize,blockSize));
            if ((i+j) % 2 == 0) {
                color_ = color1;
            }
            else {
                color_=color2;
            
            }
            ROI.setTo(color_);
        }
    }


    cvtColor(chessBoard,chessBoard,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return chessBoard;
}